

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void com_get_nbr_c(pel *dst,int ipm_c,int ipm,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *ppVar1;
  undefined2 uVar2;
  pel pVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  pel *ppVar8;
  long lVar9;
  ulong uVar10;
  size_t __n;
  uint uVar11;
  pel *ppVar12;
  pel *ppVar13;
  int iVar14;
  com_scu_t *pcVar15;
  int iVar16;
  int __c;
  s16 *pdst;
  
  __c = 1 << ((char)bit_depth - 1U & 0x1f);
  iVar4 = height;
  if (height < width) {
    iVar4 = width;
  }
  iVar4 = iVar4 * 2 + 4;
  if ((ipm_c != 2) && (ipm_c != 0 || ipm < 0x18)) {
    ppVar13 = dst + 2;
    if ((avail_cu & 1) == 0) {
      memset(ppVar13,__c,(long)(iVar4 * 2));
    }
    else {
      iVar5 = width >> 1;
      pcVar15 = map_scu + (long)iVar5 + ((long)scup - (long)i_scu);
      __n = (size_t)(width * 2);
      memcpy(ppVar13,srcT,__n);
      ppVar13 = ppVar13 + __n;
      ppVar12 = srcT + __n;
      iVar14 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (; (iVar16 = iVar5, iVar14 != iVar5 && (iVar16 = iVar14, ((byte)*pcVar15 & 1) != 0));
          pcVar15 = pcVar15 + 1) {
        *(undefined4 *)ppVar13 = *(undefined4 *)ppVar12;
        iVar14 = iVar14 + 1;
        ppVar13 = ppVar13 + 4;
        ppVar12 = ppVar12 + 4;
      }
      uVar2 = *(undefined2 *)(ppVar13 + -2);
      uVar7 = iVar4 - (width + iVar16 * 2);
      uVar10 = 0;
      uVar6 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)(ppVar13 + uVar10 * 2) = uVar2;
      }
    }
    if (ipm_c == 3) goto LAB_001165ea;
  }
  if (ipm_c != 0 || ipm - 0xdU < 0xfffffff6) {
    ppVar13 = dst + -2;
    if ((avail_cu & 2) == 0) {
      memset(ppVar13 + (2 - (long)(iVar4 * 2)),__c,(long)(iVar4 * 2));
    }
    else {
      iVar5 = height >> 1;
      lVar9 = (long)s_src;
      ppVar12 = srcL;
      for (iVar14 = 0; iVar14 < height; iVar14 = iVar14 + 2) {
        *(undefined2 *)ppVar13 = *(undefined2 *)ppVar12;
        ppVar8 = ppVar12 + lVar9;
        ppVar12 = ppVar12 + lVar9 * 2;
        *(undefined2 *)(ppVar13 + -2) = *(undefined2 *)ppVar8;
        ppVar13 = ppVar13 + -4;
      }
      pcVar15 = map_scu + (long)(i_scu * iVar5) + (long)scup + -1;
      iVar14 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar14;
      }
      ppVar8 = ppVar13 + 2;
      for (; (iVar16 = iVar5, iVar14 != iVar5 && (iVar16 = iVar14, ((byte)*pcVar15 & 1) != 0));
          pcVar15 = pcVar15 + i_scu) {
        *(undefined2 *)ppVar13 = *(undefined2 *)ppVar12;
        ppVar1 = ppVar12 + lVar9;
        ppVar12 = ppVar12 + lVar9 * 2;
        *(undefined2 *)(ppVar13 + -2) = *(undefined2 *)ppVar1;
        ppVar13 = ppVar13 + -4;
        iVar14 = iVar14 + 1;
        ppVar8 = ppVar8 + -4;
      }
      uVar2 = *(undefined2 *)(ppVar13 + 2);
      uVar11 = iVar4 - (height + iVar16 * 2);
      uVar6 = 0;
      uVar7 = uVar11;
      if ((int)uVar11 < 1) {
        uVar7 = 0;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined2 *)(ppVar8 + (uVar6 * 2 - (long)(int)(uVar11 * 2))) = uVar2;
      }
    }
  }
LAB_001165ea:
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) == 0) {
        dst[1] = (pel)__c;
        *dst = (pel)__c;
        return;
      }
      *dst = *srcL;
      pVar3 = srcL[1];
    }
    else {
      *dst = *srcT;
      pVar3 = srcT[1];
    }
  }
  else {
    *dst = srcT[-2];
    pVar3 = srcT[-1];
  }
  dst[1] = pVar3;
  return;
}

Assistant:

void com_get_nbr_c(pel *dst, int ipm_c, int ipm, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> (MIN_CU_LOG2 - 1);
    int  height_in_scu = height >> (MIN_CU_LOG2 - 1);
    pel *srcTL = srcT - 2;
    pel *up   = dst + 2;
    pel *left = dst - 2;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;

    int width2 = width << 1;
    int height2 = height << 1;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm_c != IPD_HOR_C && (ipm_c != IPD_DM_C || ipm < IPD_HOR)) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;

            memcpy(up, srcT, width2 * sizeof(pel));
            up += width2, srcT += width2;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            const int shift = sizeof(pel) * 8;
            int uv_pixel = (up[-1] << shift) + up[-2];
            com_mset_2pel(up, uv_pixel, pad_range - (width + i * MIN_CU_SIZE / 2));
        } else {
            com_mset_pel(up, default_val, pad_range << 1);
        }
    }
    if (ipm_c != IPD_VER_C && (ipm_c != IPD_DM_C || ipm <= IPD_BI || ipm > IPD_VER)) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i+=2) {
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                } else {
                    break;
                }
            }

            const int shift = sizeof(pel) * 8;
            int uv_pixel = (left[3] << shift) + left[2];
            int pads = pad_range - height - i * MIN_CU_SIZE / 2;
            com_mset_2pel(left - pads * 2 + 2, uv_pixel, pads);
        } else {
            com_mset_pel(left - (pad_range << 1) + 2, default_val, pad_range << 1);
        }
    }
    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
        dst[1] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[2];
        dst[1] = srcTL[3];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
        dst[1] = srcL[1];
    } else {
        dst[0] = dst[1] = default_val;
    }
}